

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildCommand.cxx
# Opt level: O0

bool __thiscall
cmCTestBuildCommand::InitialPass
          (cmCTestBuildCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *status)

{
  cmMakefile *pcVar1;
  int iVar2;
  ulong uVar3;
  string local_98;
  string_view local_78;
  string local_58;
  string_view local_38;
  byte local_21;
  cmExecutionStatus *pcStack_20;
  bool ret;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  cmCTestBuildCommand *this_local;
  
  pcStack_20 = status;
  status_local = (cmExecutionStatus *)args;
  args_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)this;
  local_21 = cmCTestHandlerCommand::InitialPass(&this->super_cmCTestHandlerCommand,args,status);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    iVar2 = cmCTestBuildHandler::GetTotalErrors(this->Handler);
    std::__cxx11::to_string(&local_58,iVar2);
    local_38 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_58);
    cmMakefile::AddDefinition(pcVar1,&this->NumberErrors,local_38);
    std::__cxx11::string::~string((string *)&local_58);
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    pcVar1 = (this->super_cmCTestHandlerCommand).super_cmCTestCommand.super_cmCommand.Makefile;
    iVar2 = cmCTestBuildHandler::GetTotalWarnings(this->Handler);
    std::__cxx11::to_string(&local_98,iVar2);
    local_78 = (string_view)
               std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_98);
    cmMakefile::AddDefinition(pcVar1,&this->NumberWarnings,local_78);
    std::__cxx11::string::~string((string *)&local_98);
  }
  return (bool)(local_21 & 1);
}

Assistant:

bool cmCTestBuildCommand::InitialPass(std::vector<std::string> const& args,
                                      cmExecutionStatus& status)
{
  bool ret = this->cmCTestHandlerCommand::InitialPass(args, status);
  if (!this->NumberErrors.empty()) {
    this->Makefile->AddDefinition(
      this->NumberErrors, std::to_string(this->Handler->GetTotalErrors()));
  }
  if (!this->NumberWarnings.empty()) {
    this->Makefile->AddDefinition(
      this->NumberWarnings, std::to_string(this->Handler->GetTotalWarnings()));
  }
  return ret;
}